

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.h
# Opt level: O0

uintptr_t __thiscall google::protobuf::internal::MessageCreator::arena_bits(MessageCreator *this)

{
  Tag TVar1;
  int v1;
  int v2;
  LogMessage *pLVar2;
  undefined1 auVar3 [16];
  LogMessageFatal local_30 [23];
  Voidify local_19;
  string *local_18;
  string *absl_log_internal_check_op_result;
  MessageCreator *this_local;
  
  absl_log_internal_check_op_result = (string *)this;
  TVar1 = tag(this);
  v1 = absl::lts_20240722::log_internal::GetReferenceableValue((int)TVar1);
  v2 = absl::lts_20240722::log_internal::GetReferenceableValue(-1);
  local_18 = absl::lts_20240722::log_internal::Check_NEImpl_abi_cxx11_(v1,v2,"+tag() != +kFunc");
  if (local_18 != (string *)0x0) {
    auVar3 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_18);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/message_lite.h"
               ,0x8a,auVar3._0_8_,auVar3._8_8_);
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_30);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_19,pLVar2);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_30);
  }
  return (uintptr_t)(this->field_3).func_;
}

Assistant:

uintptr_t arena_bits() const {
    ABSL_DCHECK_NE(+tag(), +kFunc);
    return arena_bits_;
  }